

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

int Gia_RsbCost(Gia_RsbMan_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  iVar1 = p->vSets[0]->nSize;
  if ((long)iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = p->vSets[1]->nSize;
    lVar4 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    iVar2 = 0;
    do {
      if (uVar3 <= iVar1 - 1U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar2 = iVar2 + *(int *)((long)&p->vSets[1]->pArray->nSize + lVar4) *
                      *(int *)((long)&p->vSets[0]->pArray->nSize + lVar4);
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar4);
  }
  return iVar2;
}

Assistant:

int Gia_RsbCost( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; int i, Cost = 0;
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
        Cost += Vec_IntSize(vLevel[0]) * Vec_IntSize(vLevel[1]);
    return Cost;
}